

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O3

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::WriteLinearConExpr
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *this)

{
  function<void_(int)> *this_00;
  uint i;
  SingleSparseDblVecWrtFactory vwf;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  SingleSparseVecWrtFactory<int,_double> local_68;
  
  if (0 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons) {
    this_00 = &local_68.hdr_prn_;
    i = 0;
    do {
      local_88._4_4_ = 0;
      local_88._0_4_ = i;
      local_70 = std::
                 _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/mp/nl-writer2.hpp:592:13)>
                 ::_M_invoke;
      local_78 = std::
                 _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/mp/nl-writer2.hpp:592:13)>
                 ::_M_manager;
      local_68.fmt_ = (char *)0x0;
      local_88._8_8_ = this;
      local_68.nlw_ = this;
      std::function<void_(int)>::function(this_00,(function<void_(int)> *)&local_88);
      local_68.nInst_ = 0;
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,__destroy_functor);
      }
      NLFeeder_Easy::
      FeedLinearConExpr<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::SingleSparseVecWrtFactory<int,double>>
                (this->feeder_,i,&local_68);
      if (local_68.hdr_prn_.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_68.hdr_prn_.super__Function_base._M_manager)
                  ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
      }
      i = i + 1;
    } while ((int)i < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons);
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteLinearConExpr() {
  for (int i=0; i<Hdr().num_algebraic_cons; ++i) {
    SingleSparseDblVecWrtFactory
        vwf(*this,
            [i, this](int nnz){
      this->apr(this->nm, "J%d %d\n", i, nnz);
    });
    Feeder().FeedLinearConExpr(i, vwf);
  }
}